

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

CScript * GetScriptForRawPubKey(CPubKey *pubKey)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> b;
  allocator_type *__a;
  CScript *pCVar2;
  uchar *in_RSI;
  CScript *in_RDI;
  long in_FS_OFFSET;
  allocator<unsigned_char> *in_stack_ffffffffffffff48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_ffffffffffffff58;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CScript::CScript((CScript *)in_stack_ffffffffffffff48);
  __a = (allocator_type *)CPubKey::begin((CPubKey *)in_stack_ffffffffffffff48);
  pCVar2 = (CScript *)CPubKey::end((CPubKey *)in_stack_ffffffffffffff58);
  std::allocator<unsigned_char>::allocator(in_stack_ffffffffffffff48);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            (in_stack_ffffffffffffff90,in_RSI,(uchar *)in_stack_ffffffffffffff88._M_extent_value,__a
            );
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  b._M_extent._M_extent_value = in_stack_ffffffffffffff88._M_extent_value;
  b._M_ptr = (pointer)__a;
  pCVar2 = CScript::operator<<(pCVar2,b);
  CScript::operator<<((CScript *)__a,(opcodetype)((ulong)in_RDI >> 0x20));
  CScript::CScript((CScript *)in_stack_ffffffffffffff48,(CScript *)0xf76a6a);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pCVar2);
  std::allocator<unsigned_char>::~allocator(in_stack_ffffffffffffff48);
  CScript::~CScript((CScript *)in_stack_ffffffffffffff48);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

CScript GetScriptForRawPubKey(const CPubKey& pubKey)
{
    return CScript() << std::vector<unsigned char>(pubKey.begin(), pubKey.end()) << OP_CHECKSIG;
}